

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::ZeroCopyOutputStream::WriteCord(ZeroCopyOutputStream *this,Cord *cord)

{
  byte bVar1;
  Nonnull<cord_internal::CordRep_*> tree;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  ulong __n;
  char *__src;
  undefined4 uVar7;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar8;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Dd;
  int buffer_size;
  void *buffer;
  ChunkIterator __begin2;
  uint local_d4;
  void *local_d0;
  ChunkIterator local_c8;
  
  uVar4 = (ulong)(cord->contents_).data_.rep_.field_0.data[0];
  if ((uVar4 & 1) == 0) {
    uVar4 = uVar4 >> 1;
  }
  else {
    uVar4 = ((cord->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (uVar4 == 0) {
LAB_0023f9c4:
    bVar2 = true;
  }
  else {
    local_d4 = 0;
    iVar3 = (*this->_vptr_ZeroCopyOutputStream[2])(this,&local_d0);
    if ((char)iVar3 != '\0') {
      uVar7 = 0;
      uVar8 = 0;
      uVar9 = 0;
      uVar10 = 0;
      local_c8.current_leaf_ = (Nullable<absl::cord_internal::CordRep_*>)0x0;
      local_c8.bytes_remaining_ = 0;
      local_c8.current_chunk_ = (string_view)ZEXT816(0);
      local_c8.btree_reader_.remaining_ = 0;
      local_c8.btree_reader_.navigator_.height_ = -1;
      bVar1 = (cord->contents_).data_.rep_.field_0.data[0];
      tree = (cord->contents_).data_.rep_.field_0.as_tree.rep;
      if (tree == (Nonnull<cord_internal::CordRep_*>)0x0 || ((long)(char)bVar1 & 1U) == 0) {
        if ((bVar1 & 1) != 0) goto LAB_0023f9e1;
        local_c8.bytes_remaining_ = (ulong)(long)(char)bVar1 >> 1;
        local_c8.current_chunk_._M_str = (char *)((long)&(cord->contents_).data_.rep_.field_0 + 1);
        local_c8.current_chunk_._M_len = local_c8.bytes_remaining_;
      }
      else {
        local_c8.bytes_remaining_ = tree->length;
        if (local_c8.bytes_remaining_ == 0) goto LAB_0023f9e6;
        absl::lts_20250127::Cord::ChunkIterator::InitTree(&local_c8,tree);
      }
LAB_0023f8e0:
      if (local_c8.bytes_remaining_ != 0) {
        do {
          sVar6 = local_c8.current_chunk_._M_len;
          __src = local_c8.current_chunk_._M_str;
          do {
            __n = sVar6;
            uVar4 = (ulong)(int)local_d4;
            if (__n <= uVar4) {
              memcpy(local_d0,__src,__n);
              local_d0 = (void *)((long)local_d0 + __n);
              local_d4 = local_d4 - (int)__n;
              break;
            }
            memcpy(local_d0,__src,uVar4);
            lVar5 = (long)(int)local_d4;
            __src = __src + lVar5;
            iVar3 = (*this->_vptr_ZeroCopyOutputStream[2])(this,&local_d0,&local_d4);
            sVar6 = __n - lVar5;
          } while ((char)iVar3 != '\0');
          if (uVar4 < __n) goto LAB_0023f9c8;
          if (local_c8.bytes_remaining_ == 0) goto LAB_0023f9dc;
          sVar6 = local_c8.bytes_remaining_ - local_c8.current_chunk_._M_len;
          if (local_c8.bytes_remaining_ < local_c8.current_chunk_._M_len) {
            __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                          ,0x611,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
          }
          local_c8.bytes_remaining_ = sVar6;
          if (sVar6 != 0) {
            if (((long)local_c8.btree_reader_.navigator_.height_ < 0) ||
               (local_c8.btree_reader_.navigator_.node_[local_c8.btree_reader_.navigator_.height_]
                == (CordRepBtree *)0x0)) {
              if (local_c8.current_chunk_._M_len == 0) {
                __assert_fail("!current_chunk_.empty()",
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                              ,0x617,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()")
                ;
              }
              local_c8.current_chunk_ = (string_view)ZEXT816(0);
            }
            else {
              local_c8.current_chunk_ =
                   absl::lts_20250127::cord_internal::CordRepBtreeReader::Next
                             (&local_c8.btree_reader_);
            }
          }
          if (local_c8.bytes_remaining_ == 0) break;
        } while( true );
      }
      (*this->_vptr_ZeroCopyOutputStream[3])(this,(ulong)local_d4);
      goto LAB_0023f9c4;
    }
LAB_0023f9c8:
    bVar2 = false;
  }
  return bVar2;
LAB_0023f9dc:
  WriteCord();
LAB_0023f9e1:
  WriteCord();
  uVar7 = extraout_XMM0_Da;
  uVar8 = extraout_XMM0_Db;
  uVar9 = extraout_XMM0_Dc;
  uVar10 = extraout_XMM0_Dd;
LAB_0023f9e6:
  local_c8.current_chunk_._M_len._4_4_ = uVar8;
  local_c8.current_chunk_._M_len._0_4_ = uVar7;
  local_c8.current_chunk_._M_str._0_4_ = uVar9;
  local_c8.current_chunk_._M_str._4_4_ = uVar10;
  goto LAB_0023f8e0;
}

Assistant:

bool ZeroCopyOutputStream::WriteCord(const absl::Cord& cord) {
  if (cord.empty()) return true;

  void* buffer;
  int buffer_size = 0;
  if (!Next(&buffer, &buffer_size)) return false;

  for (absl::string_view fragment : cord.Chunks()) {
    while (fragment.size() > static_cast<size_t>(buffer_size)) {
      std::memcpy(buffer, fragment.data(), buffer_size);

      fragment.remove_prefix(buffer_size);

      if (!Next(&buffer, &buffer_size)) return false;
    }
    std::memcpy(buffer, fragment.data(), fragment.size());

    // Advance the buffer.
    buffer = static_cast<char*>(buffer) + fragment.size();
    buffer_size -= static_cast<int>(fragment.size());
  }
  BackUp(buffer_size);
  return true;
}